

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O0

int txt_np(char *dest,int sd)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char *in_RDI;
  int res;
  int i;
  distribution *src;
  char *parse_target;
  char *cptr;
  char syntax [13];
  int iVar4;
  uint in_stack_ffffffffffffffc4;
  undefined8 in_stack_ffffffffffffffc8;
  distribution *pdVar5;
  distribution *in_stack_ffffffffffffffd0;
  distribution *s;
  undefined1 local_19 [25];
  
  iVar4 = 0;
  local_19._17_8_ = in_RDI;
  pick_str(in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
           (char *)((ulong)in_stack_ffffffffffffffc4 << 0x20));
  s = (distribution *)local_19;
  while (pcVar2 = strtok((char *)s," "), pcVar2 != (char *)0x0) {
    pdVar5 = (distribution *)0x0;
    switch(*pcVar2) {
    case 'A':
      pdVar5 = &articles;
      break;
    case 'D':
      pdVar5 = &adverbs;
      break;
    case 'J':
      pdVar5 = &adjectives;
      break;
    case 'N':
      pdVar5 = &nouns;
    }
    iVar1 = pick_str(s,0,(char *)CONCAT44(in_stack_ffffffffffffffc4,iVar4));
    sVar3 = strlen(pdVar5->list[iVar1].text);
    in_stack_ffffffffffffffc4 = (uint)sVar3;
    local_19._17_8_ = local_19._17_8_ + (long)(int)in_stack_ffffffffffffffc4;
    iVar4 = in_stack_ffffffffffffffc4 + iVar4;
    if (pcVar2[1] != '\0') {
      *(char *)local_19._17_8_ = pcVar2[1];
      local_19._17_8_ = local_19._17_8_ + 1;
      iVar4 = iVar4 + 1;
    }
    *(char *)local_19._17_8_ = ' ';
    local_19._17_8_ = local_19._17_8_ + 1;
    iVar4 = iVar4 + 1;
    s = (distribution *)0x0;
  }
  return iVar4;
}

Assistant:

static int
txt_np(char *dest, int sd) 
{
	char syntax[MAX_GRAMMAR_LEN + 1],
		*cptr,
		*parse_target;
	distribution *src;
	int i,
		res = 0;

	
	pick_str(&np, sd, &syntax[0]);
	parse_target = syntax;
	while ((cptr = strtok(parse_target, " ")) != NULL)
	{
		src = NULL;
		switch(*cptr)
		{
		case 'A':
			src = &articles;
			break;
		case 'J':
			src = &adjectives;
			break;
		case 'D':
			src = &adverbs;
			break;
		case 'N': 
			src = &nouns;
			break;
		}	/* end of POS switch statement */
		i = pick_str(src, sd, dest);
		i = strlen(DIST_MEMBER(src, i));
		dest += i;
		res += i;
		if (*(++cptr))	/* miscelaneous fillagree, like punctuation */
		{
			*dest = *cptr;
			dest += 1;
			res += 1;
		}
		*dest = ' ';
		dest++;
		res++;
		parse_target = NULL;
	}	/* end of while loop */

	return(res);
}